

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::SummaryTest_max_age_Test::TestBody(SummaryTest_max_age_Test *this)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  double ref;
  int local_134;
  duration<long,_std::ratio<1L,_1000L>_> local_130;
  int local_124;
  duration<long,_std::ratio<1L,_1000L>_> local_120;
  anon_class_8_1_14a0da86 local_118;
  anon_class_8_1_14a0da86 test_value;
  duration<long,_std::ratio<1L,_1L>_> local_108;
  milliseconds local_100;
  allocator<prometheus::detail::CKMSQuantiles::Quantile> local_e1;
  Quantile local_e0;
  Quantile *local_c0;
  size_type local_b8;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  local_b0;
  undefined1 local_98 [8];
  Summary summary;
  SummaryTest_max_age_Test *this_local;
  
  summary.quantile_values_.rotation_interval_.__r = (rep)this;
  detail::CKMSQuantiles::Quantile::Quantile(&local_e0,0.99,0.001);
  local_b8 = 1;
  local_c0 = &local_e0;
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::allocator(&local_e1);
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&local_b0,__l,&local_e1);
  test_value.summary._4_4_ = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_108,(int *)((long)&test_value.summary + 4));
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_100,&local_108);
  Summary::Summary((Summary *)local_98,&local_b0,local_100,2);
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~vector(&local_b0);
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::~allocator(&local_e1);
  Summary::Observe((Summary *)local_98,8.0);
  local_118.summary = (Summary *)local_98;
  TestBody::anon_class_8_1_14a0da86::operator()(&local_118,8.0);
  local_124 = 600;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_120,&local_124);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_120);
  TestBody::anon_class_8_1_14a0da86::operator()(&local_118,8.0);
  local_134 = 600;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_130,&local_134);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_130);
  ref = std::numeric_limits<double>::quiet_NaN();
  TestBody::anon_class_8_1_14a0da86::operator()(&local_118,ref);
  Summary::~Summary((Summary *)local_98);
  return;
}

Assistant:

TEST(SummaryTest, max_age) {
  Summary summary{Summary::Quantiles{{0.99, 0.001}}, std::chrono::seconds(1),
                  2};
  summary.Observe(8.0);

  const auto test_value = [&summary](double ref) {
    auto metric = summary.Collect();
    auto s = metric.summary;
    ASSERT_EQ(s.quantile.size(), 1U);

    if (std::isnan(ref))
      EXPECT_TRUE(std::isnan(s.quantile.at(0).value));
    else
      EXPECT_DOUBLE_EQ(s.quantile.at(0).value, ref);
  };

  test_value(8.0);
  std::this_thread::sleep_for(std::chrono::milliseconds(600));
  test_value(8.0);
  std::this_thread::sleep_for(std::chrono::milliseconds(600));
  test_value(std::numeric_limits<double>::quiet_NaN());
}